

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O2

bool __thiscall FIX::DataDictionary::getFieldName(DataDictionary *this,int field,string *name)

{
  const_iterator cVar1;
  _Rb_tree_header *p_Var2;
  int local_1c;
  
  local_1c = field;
  cVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->m_fieldNames)._M_t,&local_1c);
  p_Var2 = &(this->m_fieldNames)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar1._M_node != p_Var2) {
    std::__cxx11::string::_M_assign((string *)name);
  }
  return (_Rb_tree_header *)cVar1._M_node != p_Var2;
}

Assistant:

bool getFieldName(int field, std::string &name) const {
    FieldToName::const_iterator i = m_fieldNames.find(field);
    if (i == m_fieldNames.end()) {
      return false;
    }
    name = i->second;
    return true;
  }